

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O1

bool __thiscall F7ZFile::Open(F7ZFile *this,bool quiet)

{
  undefined8 *puVar1;
  UInt64 *pUVar2;
  uint uVar3;
  SRes SVar4;
  size_t c;
  C7zArchive *pCVar5;
  ulong *puVar6;
  size_t sVar7;
  size_t sVar8;
  char cVar9;
  bool bVar10;
  undefined7 in_register_00000031;
  long lVar11;
  char *format;
  ulong uVar12;
  int iVar13;
  FResourceLump *this_00;
  FString name;
  TArray<char,_char> nameASCII;
  TArray<unsigned_short,_unsigned_short> nameUTF16;
  TArray<char,_char> local_78;
  undefined4 local_5c;
  TArray<char,_char> local_58;
  TArray<unsigned_short,_unsigned_short> local_48;
  FString local_38;
  
  pCVar5 = (C7zArchive *)operator_new(0x4140);
  C7zArchive::C7zArchive(pCVar5,(this->super_FResourceFile).Reader);
  this->Archive = pCVar5;
  uVar3 = SzArEx_Open((CSzArEx *)pCVar5,&(pCVar5->LookStream).s,&g_Alloc,&g_Alloc);
  pCVar5 = this->Archive;
  local_5c = (undefined4)CONCAT71(in_register_00000031,quiet);
  if (uVar3 != 0) {
    if (pCVar5 != (C7zArchive *)0x0) {
      C7zArchive::~C7zArchive(pCVar5);
      operator_delete(pCVar5,0x4140);
    }
    this->Archive = (C7zArchive *)0x0;
    if (quiet) {
      return false;
    }
    Printf("\n\x1cG%s: ",(this->super_FResourceFile).Filename);
    if (uVar3 == 2) {
      format = "Cannot allocate memory\n";
    }
    else if (uVar3 == 3) {
      format = "CRC error\n";
    }
    else {
      if (uVar3 != 4) {
        Printf("error #%d\n",(ulong)uVar3);
        return false;
      }
      format = "Decoder does not support this archive\n";
    }
    Printf(format);
    return false;
  }
  uVar3 = (pCVar5->DB).NumFiles;
  uVar12 = (ulong)uVar3;
  (this->super_FResourceFile).NumLumps = uVar3;
  puVar6 = (ulong *)operator_new__(uVar12 * 0x50 + 8);
  this_00 = (FResourceLump *)(puVar6 + 1);
  *puVar6 = uVar12;
  if (uVar12 != 0) {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)puVar6 + lVar11 + 0x18) = 0x727dbc;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      *(undefined2 *)((long)puVar6 + lVar11 + 0x30) = 0;
      *(undefined1 *)((long)puVar6 + lVar11 + 0x20) = 0;
      puVar1 = (undefined8 *)((long)puVar6 + lVar11 + 0x38);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)puVar6 + lVar11 + 0x44);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined ***)
       ((long)&((FResourceLump *)&this_00->_vptr_FResourceLump)->_vptr_FResourceLump + lVar11) =
           &PTR__FResourceLump_0070d1f0;
      lVar11 = lVar11 + 0x50;
    } while (uVar12 * 0x50 != lVar11);
  }
  this->Lumps = (F7ZLump *)this_00;
  local_48.Array = (UInt16 *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  local_58.Array = (char *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  if ((this->super_FResourceFile).NumLumps == 0) {
    iVar13 = 0;
    uVar3 = 0;
  }
  else {
    uVar12 = 0;
    iVar13 = 0;
    do {
      if (((char)((pCVar5->DB).IsDirs[uVar12 >> 3 & 0x1fffffff] << ((byte)uVar12 & 7)) < '\0') ||
         (sVar7 = SzArEx_GetFileNameUtf16(&pCVar5->DB,uVar12,(UInt16 *)0x0), sVar7 == 0)) {
        iVar13 = iVar13 + 1;
      }
      else {
        TArray<unsigned_short,_unsigned_short>::Resize(&local_48,(uint)sVar7);
        TArray<char,_char>::Resize(&local_58,(uint)sVar7);
        SzArEx_GetFileNameUtf16(&pCVar5->DB,uVar12,local_48.Array);
        sVar8 = 0;
        do {
          local_58.Array[sVar8] = (char)local_48.Array[sVar8];
          sVar8 = sVar8 + 1;
        } while (sVar7 != sVar8);
        FixPathSeperator(local_58.Array);
        FString::FString((FString *)&local_78,local_58.Array);
        FString::ToLower((FString *)&local_78);
        FString::AttachToOther(&local_38,(FString *)&local_78);
        FResourceLump::LumpNameSetup(this_00,&local_38);
        FString::~FString(&local_38);
        pUVar2 = (pCVar5->DB).UnpackPositions;
        this_00->LumpSize = (int)pUVar2[uVar12 + 1] - (int)pUVar2[uVar12];
        this_00->Owner = &this->super_FResourceFile;
        this_00->Flags = '\x02';
        *(int *)&this_00->field_0x4c = (int)uVar12;
        FResourceLump::CheckEmbedded(this_00);
        this_00 = this_00 + 1;
        FString::~FString((FString *)&local_78);
      }
      uVar12 = uVar12 + 1;
      uVar3 = (this->super_FResourceFile).NumLumps;
    } while (uVar12 < uVar3);
  }
  (this->super_FResourceFile).NumLumps = uVar3 - iVar13;
  cVar9 = (char)local_5c;
  if (uVar3 - iVar13 != 0) {
    local_78.Array = (char *)0x0;
    local_78.Most = 0;
    local_78.Count = 0;
    TArray<char,_char>::Resize(&local_78,(this->Lumps->super_FResourceLump).LumpSize);
    SVar4 = C7zArchive::Extract(this->Archive,
                                *(UInt32 *)&(this->Lumps->super_FResourceLump).field_0x4c,
                                local_78.Array);
    if (SVar4 != 0) {
      if (cVar9 == '\0') {
        Printf("\n%s: unsupported 7z/LZMA file!\n",(this->super_FResourceFile).Filename);
      }
      TArray<char,_char>::~TArray(&local_78);
      bVar10 = false;
      goto LAB_004d48db;
    }
    TArray<char,_char>::~TArray(&local_78);
  }
  if ((cVar9 == '\0') && (batchrun == false)) {
    Printf(", %d lumps\n",(ulong)(this->super_FResourceFile).NumLumps);
  }
  bVar10 = true;
  FResourceFile::PostProcessArchive(&this->super_FResourceFile,this->Lumps,0x50);
LAB_004d48db:
  TArray<char,_char>::~TArray(&local_58);
  TArray<unsigned_short,_unsigned_short>::~TArray(&local_48);
  return bVar10;
}

Assistant:

bool F7ZFile::Open(bool quiet)
{
	Archive = new C7zArchive(Reader);
	int skipped = 0;
	SRes res;

	res = Archive->Open();
	if (res != SZ_OK)
	{
		delete Archive;
		Archive = NULL;
		if (!quiet)
		{
			Printf("\n" TEXTCOLOR_RED "%s: ", Filename);
			if (res == SZ_ERROR_UNSUPPORTED)
			{
				Printf("Decoder does not support this archive\n");
			}
			else if (res == SZ_ERROR_MEM)
			{
				Printf("Cannot allocate memory\n");
			}
			else if (res == SZ_ERROR_CRC)
			{
				Printf("CRC error\n");
			}
			else
			{
				Printf("error #%d\n", res);
			}
		}
		return false;
	}

	CSzArEx* const archPtr = &Archive->DB;

	NumLumps = archPtr->NumFiles;
	Lumps = new F7ZLump[NumLumps];

	F7ZLump *lump_p = Lumps;
	TArray<UInt16> nameUTF16;
	TArray<char> nameASCII;

	for (DWORD i = 0; i < NumLumps; ++i)
	{
		// skip Directories
		if (SzArEx_IsDir(archPtr, i))
		{
			skipped++;
			continue;
		}

		const size_t nameLength = SzArEx_GetFileNameUtf16(archPtr, i, NULL);

		if (0 == nameLength)
		{
			++skipped;
			continue;
		}

		nameUTF16.Resize((unsigned)nameLength);
		nameASCII.Resize((unsigned)nameLength);
		SzArEx_GetFileNameUtf16(archPtr, i, &nameUTF16[0]);
		for (size_t c = 0; c < nameLength; ++c)
		{
			nameASCII[c] = static_cast<char>(nameUTF16[c]);
		}
		FixPathSeperator(&nameASCII[0]);

		FString name = &nameASCII[0];
		name.ToLower();

		lump_p->LumpNameSetup(name);
		lump_p->LumpSize = static_cast<int>(SzArEx_GetFileSize(archPtr, i));
		lump_p->Owner = this;
		lump_p->Flags = LUMPF_ZIPFILE;
		lump_p->Position = i;
		lump_p->CheckEmbedded();
		lump_p++;
	}
	// Resize the lump record array to its actual size
	NumLumps -= skipped;

	if (NumLumps > 0)
	{
		// Quick check for unsupported compression method

		TArray<char> temp;
		temp.Resize(Lumps[0].LumpSize);

		if (SZ_OK != Archive->Extract(Lumps[0].Position, &temp[0]))
		{
			if (!quiet) Printf("\n%s: unsupported 7z/LZMA file!\n", Filename);
			return false;
		}
	}

	if (!quiet && !batchrun) Printf(", %d lumps\n", NumLumps);

	PostProcessArchive(&Lumps[0], sizeof(F7ZLump));
	return true;
}